

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void __thiscall Scene::~Scene(Scene *this)

{
  Mesh *pMVar1;
  Skybox *this_00;
  pointer ppMVar2;
  ulong uVar3;
  
  operator_delete(this->camera);
  ppMVar2 = (this->_childeren).super__Vector_base<Mesh_*,_std::allocator<Mesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_childeren).super__Vector_base<Mesh_*,_std::allocator<Mesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppMVar2) {
    uVar3 = 0;
    do {
      pMVar1 = ppMVar2[uVar3];
      if (pMVar1 != (Mesh *)0x0) {
        Mesh::~Mesh(pMVar1);
      }
      operator_delete(pMVar1);
      uVar3 = uVar3 + 1;
      ppMVar2 = (this->_childeren).super__Vector_base<Mesh_*,_std::allocator<Mesh_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->_childeren).
                                   super__Vector_base<Mesh_*,_std::allocator<Mesh_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)ppMVar2 >> 3));
  }
  pMVar1 = this->_lamp;
  if (pMVar1 != (Mesh *)0x0) {
    Mesh::~Mesh(pMVar1);
    operator_delete(pMVar1);
  }
  this_00 = this->_skybox;
  if (this_00 != (Skybox *)0x0) {
    Skybox::~Skybox(this_00);
    operator_delete(this_00);
  }
  ppMVar2 = (this->_childeren).super__Vector_base<Mesh_*,_std::allocator<Mesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppMVar2 != (pointer)0x0) {
    operator_delete(ppMVar2);
    return;
  }
  return;
}

Assistant:

Scene::~Scene() {
	delete this->camera;
	for (int i = 0; i < this->_childeren.size(); i++) {
		delete this->_childeren[i];
	}
	if (this->getLamp() != NULL) {
		delete this->getLamp();
	}
	if (this->getSkybox() != NULL) {
		delete this->getSkybox();
	}
}